

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.cpp
# Opt level: O2

vector<CKeyID,_std::allocator<CKeyID>_> * __thiscall
XOnlyPubKey::GetKeyIDs
          (vector<CKeyID,_std::allocator<CKeyID>_> *__return_storage_ptr__,XOnlyPubKey *this)

{
  long in_FS_OFFSET;
  CPubKey fullpubkey;
  CKeyID local_9d;
  CPubKey local_89;
  uchar local_48;
  undefined8 local_47;
  undefined8 uStack_3f;
  undefined8 local_37;
  undefined8 uStack_2f;
  uchar local_27 [7];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super__Vector_base<CKeyID,_std::allocator<CKeyID>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CKeyID,_std::allocator<CKeyID>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CKeyID,_std::allocator<CKeyID>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48 = '\x02';
  local_47 = *(undefined8 *)(this->m_keydata).super_base_blob<256U>.m_data._M_elems;
  uStack_3f = *(undefined8 *)((this->m_keydata).super_base_blob<256U>.m_data._M_elems + 8);
  local_37 = *(undefined8 *)((this->m_keydata).super_base_blob<256U>.m_data._M_elems + 0x10);
  uStack_2f = *(undefined8 *)((this->m_keydata).super_base_blob<256U>.m_data._M_elems + 0x18);
  local_89.vch[0] = 0xff;
  CPubKey::Set<unsigned_char*>(&local_89,&local_48,local_27);
  CPubKey::GetID(&local_9d,&local_89);
  std::vector<CKeyID,_std::allocator<CKeyID>_>::emplace_back<CKeyID>
            (__return_storage_ptr__,&local_9d);
  local_48 = '\x03';
  CPubKey::Set<unsigned_char*>(&local_89,&local_48,local_27);
  CPubKey::GetID(&local_9d,&local_89);
  std::vector<CKeyID,_std::allocator<CKeyID>_>::emplace_back<CKeyID>
            (__return_storage_ptr__,&local_9d);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CKeyID> XOnlyPubKey::GetKeyIDs() const
{
    std::vector<CKeyID> out;
    // For now, use the old full pubkey-based key derivation logic. As it is indexed by
    // Hash160(full pubkey), we need to return both a version prefixed with 0x02, and one
    // with 0x03.
    unsigned char b[33] = {0x02};
    std::copy(m_keydata.begin(), m_keydata.end(), b + 1);
    CPubKey fullpubkey;
    fullpubkey.Set(b, b + 33);
    out.push_back(fullpubkey.GetID());
    b[0] = 0x03;
    fullpubkey.Set(b, b + 33);
    out.push_back(fullpubkey.GetID());
    return out;
}